

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_indexer.hpp
# Opt level: O1

void set_reference_points<ExtIsoForest,float,long>
               (TreesIndexer *indexer,ExtIsoForest *model,bool with_distances,float *numeric_data,
               int *categ_data,bool is_col_major,size_t ld_numeric,size_t ld_categ,float *Xc,
               long *Xc_ind,long *Xc_indptr,float *Xr,long *Xr_ind,long *Xr_indptr,size_t nrows,
               int nthreads)

{
  pointer pSVar1;
  pointer puVar2;
  long lVar3;
  iterator __begin2;
  pointer pSVar4;
  double *output_depths;
  ulong uVar5;
  long *tree_num;
  vector<SingleTreeIndex,_std::allocator<SingleTreeIndex>_> *__range2;
  long lVar6;
  long lVar7;
  pointer __old_p;
  long *plVar8;
  
  pSVar4 = (indexer->indices).super__Vector_base<SingleTreeIndex,_std::allocator<SingleTreeIndex>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if ((pSVar4 == (indexer->indices).
                 super__Vector_base<SingleTreeIndex,_std::allocator<SingleTreeIndex>_>._M_impl.
                 super__Vector_impl_data._M_finish) ||
     ((with_distances &&
      ((pSVar4->node_distances).super__Vector_base<double,_std::allocator<double>_>._M_impl.
       super__Vector_impl_data._M_start ==
       (pSVar4->node_distances).super__Vector_base<double,_std::allocator<double>_>._M_impl.
       super__Vector_impl_data._M_finish)))) {
    build_tree_indices(indexer,model,nthreads,with_distances);
  }
  pSVar4 = (indexer->indices).super__Vector_base<SingleTreeIndex,_std::allocator<SingleTreeIndex>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if ((pSVar4->reference_points).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
      _M_impl.super__Vector_impl_data._M_start !=
      (pSVar4->reference_points).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
      _M_impl.super__Vector_impl_data._M_finish) {
    pSVar1 = (indexer->indices).
             super__Vector_base<SingleTreeIndex,_std::allocator<SingleTreeIndex>_>._M_impl.
             super__Vector_impl_data._M_finish;
    for (; pSVar4 != pSVar1; pSVar4 = pSVar4 + 1) {
      puVar2 = (pSVar4->reference_points).
               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_start;
      if ((pSVar4->reference_points).
          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_finish != puVar2) {
        (pSVar4->reference_points).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
        ._M_impl.super__Vector_impl_data._M_finish = puVar2;
      }
      puVar2 = (pSVar4->reference_indptr).
               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_start;
      if ((pSVar4->reference_indptr).
          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_finish != puVar2) {
        (pSVar4->reference_indptr).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
        ._M_impl.super__Vector_impl_data._M_finish = puVar2;
      }
      puVar2 = (pSVar4->reference_mapping).
               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_start;
      if ((pSVar4->reference_mapping).
          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_finish != puVar2) {
        (pSVar4->reference_mapping).
        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_finish = puVar2;
      }
    }
  }
  lVar7 = ((long)(model->hplanes).
                 super__Vector_base<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>,_std::allocator<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish -
           (long)(model->hplanes).
                 super__Vector_base<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>,_std::allocator<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555;
  output_depths = (double *)operator_new__(-(ulong)(nrows >> 0x3d != 0) | nrows * 8);
  uVar5 = lVar7 * nrows;
  tree_num = (long *)operator_new__(-(ulong)(uVar5 >> 0x3d != 0) | uVar5 * 8);
  predict_iforest<float,long>
            (numeric_data,categ_data,is_col_major,ld_numeric,ld_categ,Xc,Xc_ind,Xc_indptr,Xr,Xr_ind,
             Xr_indptr,nrows,nthreads,false,(IsoForest *)0x0,model,output_depths,tree_num,
             (double *)0x0,indexer);
  operator_delete__(output_depths);
  lVar7 = lVar7 + 1;
  lVar6 = 0x48;
  plVar8 = tree_num;
  while (lVar7 = lVar7 + -1, lVar7 != 0) {
    std::vector<unsigned_long,std::allocator<unsigned_long>>::_M_assign_aux<long*>
              ((vector<unsigned_long,std::allocator<unsigned_long>> *)
               ((long)&(((indexer->indices).
                         super__Vector_base<SingleTreeIndex,_std::allocator<SingleTreeIndex>_>.
                         _M_impl.super__Vector_impl_data._M_start)->terminal_node_mappings).
                       super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_> + lVar6),
               plVar8,plVar8 + nrows);
    pSVar4 = (indexer->indices).
             super__Vector_base<SingleTreeIndex,_std::allocator<SingleTreeIndex>_>._M_impl.
             super__Vector_impl_data._M_start;
    if (*(long *)((long)&(pSVar4->terminal_node_mappings).
                         super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_> +
                 lVar6 + 0x10) !=
        *(long *)((long)&(pSVar4->terminal_node_mappings).
                         super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_> +
                 lVar6 + 8)) {
      std::__shrink_to_fit_aux<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_true>::
      _S_do_it((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
               ((long)&(pSVar4->terminal_node_mappings).
                       super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_> + lVar6));
    }
    plVar8 = plVar8 + nrows;
    lVar3 = lVar6 + -0x48;
    lVar6 = lVar6 + 0x98;
    build_ref_node((SingleTreeIndex *)
                   ((long)(indexer->indices).
                          super__Vector_base<SingleTreeIndex,_std::allocator<SingleTreeIndex>_>.
                          _M_impl.super__Vector_impl_data._M_start + lVar3));
  }
  operator_delete__(tree_num);
  return;
}

Assistant:

void set_reference_points(TreesIndexer &indexer, Model &model, const bool with_distances,
                          real_t *restrict numeric_data, int *restrict categ_data,
                          bool is_col_major, size_t ld_numeric, size_t ld_categ,
                          real_t *restrict Xc, sparse_ix *restrict Xc_ind, sparse_ix *restrict Xc_indptr,
                          real_t *restrict Xr, sparse_ix *restrict Xr_ind, sparse_ix *restrict Xr_indptr,
                          size_t nrows, int nthreads)
{
    if (indexer.indices.empty() || (with_distances && indexer.indices.front().node_distances.empty()))
    {
        build_tree_indices(indexer, model, nthreads, with_distances);
    }

    if (!indexer.indices.front().reference_points.empty())
    {
        for (auto &tree : indexer.indices)
        {
            tree.reference_points.clear();
            tree.reference_indptr.clear();
            tree.reference_mapping.clear();
        }
    }


    size_t ntrees = get_ntrees(model);
    std::unique_ptr<double[]> ignored(new double[nrows]);
    std::unique_ptr<sparse_ix[]> node_indices_predict(new sparse_ix[nrows * ntrees]);
    void *model_ptr = (std::is_same<Model, IsoForest>::value)? &model : NULL;
    void *model_ext_ptr = (std::is_same<Model, ExtIsoForest>::value)? &model : NULL;
    predict_iforest(numeric_data, categ_data,
                    is_col_major, ld_numeric, ld_categ,
                    Xc, Xc_ind, Xc_indptr,
                    Xr, Xr_ind, Xr_indptr,
                    nrows, nthreads, false,
                    (IsoForest*)model_ptr, (ExtIsoForest*)model_ext_ptr,
                    ignored.get(), node_indices_predict.get(),
                    (double*)NULL,
                    &indexer);
    ignored.reset();

    #pragma omp parallel for schedule(dynamic) num_threads(nthreads) \
            shared(indexer, node_indices_predict, ntrees)
    for (size_t_for tree = 0; tree < (decltype(tree))ntrees; tree++)
    {
        indexer.indices[tree].reference_points.assign(node_indices_predict.get() + tree*nrows,
                                                      node_indices_predict.get() + (tree+1)*nrows);
        indexer.indices[tree].reference_points.shrink_to_fit();
        build_ref_node(indexer.indices[tree]);
    }
}